

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall QTableWidgetItem::QTableWidgetItem(QTableWidgetItem *this,QTableWidgetItem *other)

{
  Data *pDVar1;
  QTableWidgetItemPrivate *pQVar2;
  
  this->_vptr_QTableWidgetItem = (_func_int **)&PTR__QTableWidgetItem_0080f688;
  this->rtti = 0;
  pDVar1 = (other->values).d.d;
  (this->values).d.d = pDVar1;
  (this->values).d.ptr = (other->values).d.ptr;
  (this->values).d.size = (other->values).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->view = (QTableWidget *)0x0;
  pQVar2 = (QTableWidgetItemPrivate *)operator_new(0x10);
  pQVar2->q = this;
  pQVar2->id = -1;
  pQVar2->headerItem = false;
  this->d = pQVar2;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       (other->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
       super_QFlagsStorage<Qt::ItemFlag>.i;
  return;
}

Assistant:

QTableWidgetItem::QTableWidgetItem(const QTableWidgetItem &other)
    : rtti(Type), values(other.values), view(nullptr),
      d(new QTableWidgetItemPrivate(this)),
      itemFlags(other.itemFlags)
{
}